

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_put(CHAR_DATA *ch,char *argument)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *obj_00;
  OBJ_DATA *pOVar5;
  ulong uVar6;
  char *format;
  long in_RDI;
  __type_conflict2 _Var7;
  int pchance;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  OBJ_DATA *container;
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffdb88;
  int in_stack_ffffffffffffdb8c;
  OBJ_DATA *in_stack_ffffffffffffdb90;
  undefined4 in_stack_ffffffffffffdb98;
  undefined4 in_stack_ffffffffffffdb9c;
  char *in_stack_ffffffffffffdba0;
  OBJ_DATA *in_stack_ffffffffffffdbb0;
  undefined4 in_stack_ffffffffffffdbb8;
  undefined4 in_stack_ffffffffffffdbbc;
  undefined4 in_stack_ffffffffffffdbc8;
  undefined4 in_stack_ffffffffffffdbcc;
  OBJ_DATA *local_2428;
  char local_2418 [124];
  int in_stack_ffffffffffffdc64;
  undefined1 in_stack_ffffffffffffdc6b;
  int in_stack_ffffffffffffdc6c;
  CHAR_DATA *in_stack_ffffffffffffdc70;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  CHAR_DATA *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  char local_1218 [3];
  char local_1215;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  one_argument((char *)in_stack_ffffffffffffdb90,
               (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  one_argument((char *)in_stack_ffffffffffffdb90,
               (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  bVar2 = str_cmp(local_2418,"in");
  if ((!bVar2) || (bVar2 = str_cmp(local_2418,"on"), !bVar2)) {
    one_argument((char *)in_stack_ffffffffffffdb90,
                 (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  }
  if ((local_1218[0] == '\0') || (local_2418[0] == '\0')) {
    send_to_char(in_stack_ffffffffffffdba0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
  }
  else {
    bVar2 = str_cmp(local_2418,"all");
    if ((bVar2) &&
       (bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                           (char *)in_stack_ffffffffffffdbb0), bVar2)) {
      obj_00 = get_obj_here((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                            (char *)in_stack_ffffffffffffdb90);
      if (obj_00 == (OBJ_DATA *)0x0) {
        act(in_stack_ffffffffffffdba0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
            in_stack_ffffffffffffdb90,
            (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      }
      else if (obj_00->item_type == 0xf) {
        bVar2 = is_affected_obj(obj_00,(int)gsn_ice_blast);
        if (bVar2) {
          act(in_stack_ffffffffffffdba0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
              in_stack_ffffffffffffdb90,
              (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
        }
        else {
          pOVar5 = (OBJ_DATA *)(long)obj_00->value[1];
          _Var7 = std::pow<int,int>(0,0x572349);
          if (((ulong)pOVar5 & (long)_Var7) == 0) {
            bVar2 = str_cmp(local_1218,"all");
            if ((bVar2) &&
               (bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdbbc,
                                                    in_stack_ffffffffffffdbb8),
                                   (char *)in_stack_ffffffffffffdbb0), bVar2)) {
              pOVar5 = get_obj_carry(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                                     in_stack_ffffffffffffed98);
              if (pOVar5 == (OBJ_DATA *)0x0) {
                send_to_char(in_stack_ffffffffffffdba0,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
              }
              else if (pOVar5 == obj_00) {
                send_to_char(in_stack_ffffffffffffdba0,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
              }
              else {
                bVar2 = can_drop_obj((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                     in_stack_ffffffffffffdb90);
                if (bVar2) {
                  bVar2 = isCabalItem(pOVar5);
                  if (bVar2) {
                    send_to_char(in_stack_ffffffffffffdba0,
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                  }
                  else if ((pOVar5->pIndexData->limtotal < 1) || (obj_00->pIndexData->vnum == 0x1f))
                  {
                    bVar2 = is_obj_stat((OBJ_DATA *)
                                        CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98
                                                ),(int)((ulong)in_stack_ffffffffffffdb90 >> 0x20));
                    if (bVar2) {
                      send_to_char(in_stack_ffffffffffffdba0,
                                   (CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                    }
                    else {
                      iVar3 = weight_mult(pOVar5);
                      if ((iVar3 == 100) || (obj_00->pIndexData->vnum == 0x1f)) {
                        iVar3 = get_contents_number(obj_00);
                        if (iVar3 < obj_00->value[0]) {
                          iVar3 = get_contents_weight(in_stack_ffffffffffffdb90);
                          iVar4 = get_true_weight(in_stack_ffffffffffffdb90);
                          if (iVar3 + iVar4 <= obj_00->value[3]) {
                            if ((obj_00->pIndexData->vnum == 0xaec) &&
                               (bVar2 = can_wear((OBJ_DATA *)
                                                 CONCAT44(in_stack_ffffffffffffdb9c,
                                                          in_stack_ffffffffffffdb98),
                                                 (int)((ulong)in_stack_ffffffffffffdb90 >> 0x20)),
                               !bVar2)) {
                              iVar3 = number_range((int)in_stack_ffffffffffffdb90,
                                                   in_stack_ffffffffffffdb8c);
                              pOVar5->timer = (short)iVar3;
                            }
                            obj_from_char(in_stack_ffffffffffffdbb0);
                            obj_to_obj(in_stack_ffffffffffffdb90,
                                       (OBJ_DATA *)
                                       CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88)
                                      );
                            iVar3 = get_skill(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
                            if ((iVar3 != 0) &&
                               (bVar2 = is_affected_by((CHAR_DATA *)
                                                       CONCAT44(in_stack_ffffffffffffdb9c,
                                                                in_stack_ffffffffffffdb98),
                                                       (int)((ulong)in_stack_ffffffffffffdb90 >>
                                                            0x20)), bVar2)) {
                              iVar4 = number_percent();
                              if (iVar4 < iVar3) {
                                uVar6 = (ulong)obj_00->value[1];
                                _Var7 = std::pow<int,int>(0,0x572655);
                                if ((uVar6 & (long)_Var7) == 0) {
                                  act(in_stack_ffffffffffffdba0,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                      in_stack_ffffffffffffdb90,
                                      (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                       in_stack_ffffffffffffdb88),0);
                                  act(in_stack_ffffffffffffdba0,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                      in_stack_ffffffffffffdb90,
                                      (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                       in_stack_ffffffffffffdb88),0);
                                }
                                else {
                                  act(in_stack_ffffffffffffdba0,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                      in_stack_ffffffffffffdb90,
                                      (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                       in_stack_ffffffffffffdb88),0);
                                  act(in_stack_ffffffffffffdba0,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                      in_stack_ffffffffffffdb90,
                                      (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                       in_stack_ffffffffffffdb88),0);
                                }
                                check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                                              (bool)in_stack_ffffffffffffdc6b,
                                              in_stack_ffffffffffffdc64);
                                return;
                              }
                              iVar3 = obj_00->value[1];
                              _Var7 = std::pow<int,int>(0,0x57273d);
                              if (((long)iVar3 & (long)_Var7) == 0) {
                                act(in_stack_ffffffffffffdba0,
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                    in_stack_ffffffffffffdb90,
                                    (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                     in_stack_ffffffffffffdb88),0);
                                act(in_stack_ffffffffffffdba0,
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                    in_stack_ffffffffffffdb90,
                                    (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                     in_stack_ffffffffffffdb88),0);
                              }
                              else {
                                act(in_stack_ffffffffffffdba0,
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                    in_stack_ffffffffffffdb90,
                                    (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                     in_stack_ffffffffffffdb88),0);
                                act(in_stack_ffffffffffffdba0,
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                                    in_stack_ffffffffffffdb90,
                                    (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                     in_stack_ffffffffffffdb88),0);
                              }
                              check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                                            (bool)in_stack_ffffffffffffdc6b,
                                            in_stack_ffffffffffffdc64);
                              return;
                            }
                            format = (char *)(long)obj_00->value[1];
                            _Var7 = std::pow<int,int>(0,0x57281f);
                            if (((ulong)format & (long)_Var7) != 0) {
                              act(format,(CHAR_DATA *)
                                         CONCAT44(in_stack_ffffffffffffdb9c,
                                                  in_stack_ffffffffffffdb98),
                                  in_stack_ffffffffffffdb90,
                                  (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                   in_stack_ffffffffffffdb88),0);
                              act(format,(CHAR_DATA *)
                                         CONCAT44(in_stack_ffffffffffffdb9c,
                                                  in_stack_ffffffffffffdb98),
                                  in_stack_ffffffffffffdb90,
                                  (void *)CONCAT44(in_stack_ffffffffffffdb8c,
                                                   in_stack_ffffffffffffdb88),0);
                              return;
                            }
                            act(format,(CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98)
                                ,in_stack_ffffffffffffdb90,
                                (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88
                                                ),0);
                            act(format,(CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98)
                                ,in_stack_ffffffffffffdb90,
                                (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88
                                                ),0);
                            return;
                          }
                        }
                        send_to_char(in_stack_ffffffffffffdba0,
                                     (CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                      }
                      else {
                        send_to_char(in_stack_ffffffffffffdba0,
                                     (CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                      }
                    }
                  }
                  else {
                    send_to_char(in_stack_ffffffffffffdba0,
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                  }
                }
                else {
                  send_to_char(in_stack_ffffffffffffdba0,
                               (CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
                }
              }
            }
            else {
              pOVar1 = *(OBJ_DATA **)(in_RDI + 0x98);
              while (local_2428 = pOVar1, local_2428 != (OBJ_DATA *)0x0) {
                pOVar1 = local_2428->next_content;
                if (((((local_1215 == '\0') ||
                      (bVar2 = is_name(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90), bVar2))
                     && (bVar2 = can_see_obj((CHAR_DATA *)
                                             CONCAT44(in_stack_ffffffffffffdbcc,
                                                      in_stack_ffffffffffffdbc8),pOVar5), bVar2)) &&
                    ((iVar3 = weight_mult(local_2428), iVar3 == 100 && (local_2428->wear_loc == -1))
                    )) && ((local_2428 != obj_00 &&
                           ((local_2428->pIndexData->limtotal < 1 &&
                            (iVar3 = get_contents_number(obj_00), iVar3 < obj_00->value[0])))))) {
                  iVar3 = get_contents_weight(in_stack_ffffffffffffdb90);
                  iVar4 = get_true_weight(in_stack_ffffffffffffdb90);
                  if ((iVar3 + iVar4 <= obj_00->value[3]) &&
                     ((bVar2 = can_drop_obj((CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                                            in_stack_ffffffffffffdb90), bVar2 &&
                      (bVar2 = isCabalItem(local_2428), !bVar2)))) {
                    if ((obj_00->pIndexData->vnum == 0xaec) &&
                       (bVar2 = can_wear((OBJ_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                                         (int)((ulong)in_stack_ffffffffffffdb90 >> 0x20)), !bVar2))
                    {
                      iVar4 = number_range((int)in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c)
                      ;
                      local_2428->timer = (short)iVar4;
                    }
                    obj_from_char(in_stack_ffffffffffffdbb0);
                    obj_to_obj(in_stack_ffffffffffffdb90,
                               (OBJ_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
                    in_stack_ffffffffffffdb90 = (OBJ_DATA *)(long)obj_00->value[1];
                    _Var7 = std::pow<int,int>(0,0x572a86);
                    if (((ulong)in_stack_ffffffffffffdb90 & (long)_Var7) == 0) {
                      act(in_stack_ffffffffffffdba0,
                          (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                          in_stack_ffffffffffffdb90,
                          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
                      act(in_stack_ffffffffffffdba0,
                          (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                          in_stack_ffffffffffffdb90,
                          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
                    }
                    else {
                      act(in_stack_ffffffffffffdba0,
                          (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                          in_stack_ffffffffffffdb90,
                          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
                      act(in_stack_ffffffffffffdba0,
                          (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffdb98),
                          in_stack_ffffffffffffdb90,
                          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
                    }
                  }
                }
              }
            }
          }
          else {
            act(in_stack_ffffffffffffdba0,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
                in_stack_ffffffffffffdb90,
                (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
          }
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffdba0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffdba0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98));
    }
  }
  return;
}

Assistant:

void do_put(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	OBJ_DATA *container;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	int pchance;
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!str_cmp(arg2, "in") || !str_cmp(arg2, "on"))
		argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Put what in what?\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "all") || !str_prefix("all.", arg2))
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	container = get_obj_here(ch, arg2);

	if (container == nullptr)
	{
		act("I see no $T here.", ch, nullptr, arg2, TO_CHAR);
		return;
	}

	if (container->item_type != ITEM_CONTAINER)
	{
		send_to_char("That's not a container.\n\r", ch);
		return;
	}

	if (is_affected_obj(container, gsn_ice_blast))
	{
		act("$p is frozen shut!", ch, container, 0, TO_CHAR);
		return;
	}

	if (IS_SET_OLD(container->value[1], CONT_CLOSED))
	{
		act("The $d is closed.", ch, nullptr, container->name, TO_CHAR);
		return;
	}

	if (str_cmp(arg1, "all") && str_prefix("all.", arg1))
	{
		/* 'put obj container' */
		obj = get_obj_carry(ch, arg1, ch);

		if (obj == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}

		if (obj == container)
		{
			send_to_char("You can't fold it into itself.\n\r", ch);
			return;
		}

		if (!can_drop_obj(ch, obj))
		{
			send_to_char("You can't let go of it.\n\r", ch);
			return;
		}

		if (isCabalItem(obj))
		{
			send_to_char("That item is too powerful to be contained.\n\r", ch);
			return;
		}

		if (obj->pIndexData->limtotal > 0 && container->pIndexData->vnum != 31)
		{
			send_to_char("That item is too powerful to be contained.\n\r", ch);
			return;
		}

		if (is_obj_stat(obj, ITEM_NO_STASH))
		{
			send_to_char("You can't put that inside a container!\n\r", ch);
			return;
		}

		if (weight_mult(obj) != 100 && container->pIndexData->vnum != 31)
		{
			send_to_char("You have a feeling that would be a bad idea.\n\r", ch);
			return;
		}

		if (get_contents_number(container) >= container->value[0]
			|| (get_contents_weight(container) + get_true_weight(obj) > container->value[3]))
		{
			send_to_char("It won't fit.\n\r", ch);
			return;
		}

		if (container->pIndexData->vnum == OBJ_VNUM_PIT && !can_wear(container, ITEM_TAKE))
		{
			obj->timer = number_range(100, 200);
		}

		obj_from_char(obj);
		obj_to_obj(obj, container);

		pchance = get_skill(ch, gsn_palm);

		if (pchance != 0 && is_affected_by(ch, AFF_SNEAK))
		{
			if (number_percent() < pchance)
			{
				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("You attempt to silently put $p on $P.", ch, obj, container, TO_CHAR);
					act("IMM: $n palmed $p on $P", ch, obj, container, TO_IMMINROOM);
				}
				else
				{
					act("You attempt to silently put $p in $P.", ch, obj, container, TO_CHAR);
					act("IMM: $n palmed $p in $P", ch, obj, container, TO_IMMINROOM);
				}
				check_improve(ch, gsn_palm, true, 1);
			}
			else
			{
				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("You attempt to silently put $p on $P.", ch, obj, container, TO_CHAR);
					act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
				}
				else
				{
					act("You attempt to silently put $p in $P.", ch, obj, container, TO_CHAR);
					act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
				}

				check_improve(ch, gsn_palm, false, 1);
			}
		}
		else
		{
			if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
			{
				act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
				act("You put $p on $P.", ch, obj, container, TO_CHAR);
			}
			else
			{
				act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
				act("You put $p in $P.", ch, obj, container, TO_CHAR);
			}
		}
	}
	else
	{
		/* 'put all container' or 'put all.obj container' */
		for (obj = ch->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if ((arg1[3] == '\0' || is_name(&arg1[4], obj->name))
				&& can_see_obj(ch, obj)
				&& weight_mult(obj) == 100
				&& obj->wear_loc == WEAR_NONE
				&& obj != container
				&& obj->pIndexData->limtotal <= 0
				&& get_contents_number(container) < container->value[0]
				&& (get_contents_weight(container) + get_true_weight(obj) <= container->value[3])
				&& can_drop_obj(ch, obj)
				&& (!isCabalItem(obj)))
			{
				if (container->pIndexData->vnum == OBJ_VNUM_PIT && !can_wear(obj, ITEM_TAKE))
				{
					obj->timer = number_range(100, 200);
				}

				obj_from_char(obj);
				obj_to_obj(obj, container);

				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
					act("You put $p on $P.", ch, obj, container, TO_CHAR);
				}
				else
				{
					act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
					act("You put $p in $P.", ch, obj, container, TO_CHAR);
				}
			}
		}
	}
}